

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_insert(lua_State *L,int idx)

{
  TValue *pTVar1;
  int in_ESI;
  lua_State *in_RDI;
  TValue *p;
  TValue *q;
  TValue *local_48;
  
  pTVar1 = stkindex2adr(in_RDI,in_ESI);
  for (local_48 = in_RDI->top; pTVar1 < local_48; local_48 = local_48 + -1) {
    *local_48 = local_48[-1];
  }
  *pTVar1 = *in_RDI->top;
  return;
}

Assistant:

LUA_API void lua_insert(lua_State *L, int idx)
{
  TValue *q, *p = stkindex2adr(L, idx);
  api_checkvalidindex(L, p);
  for (q = L->top; q > p; q--) copyTV(L, q, q-1);
  copyTV(L, p, L->top);
}